

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::OffsetsGatherInt2D::TextBody_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  void *local_18;
  OffsetsGatherInt2D *this_local;
  
  local_18 = this;
  this_local = (OffsetsGatherInt2D *)__return_storage_ptr__;
  (**(code **)(*this + 0xb8))();
  std::operator+(__return_storage_ptr__,&local_38,
                 " test_function(vec4 p) {                                                             \n    const ivec2 offsets[4] = ivec2[](ivec2(7, 6), ivec2(-8, 7), ivec2(-6, -5), ivec2(-1, 3)); \n    return textureGatherOffsets(my_sampler, vec2(p.x, p.y), offsets);                         \n}\n"
                );
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string TextBody()
	{
		return Type() +
			   " test_function(vec4 p) {                                                             \n"
			   "    const ivec2 offsets[4] = ivec2[](ivec2(7, 6), ivec2(-8, 7), ivec2(-6, -5), ivec2(-1, 3)); \n"
			   "    return textureGatherOffsets(my_sampler, vec2(p.x, p.y), offsets);                         \n"
			   "}\n";
	}